

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O1

void __thiscall
Clasp::Asp::PrgDepGraph::addNonHcf
          (PrgDepGraph *this,uint32 id,SharedContext *ctx,Configuration *config,uint32 scc)

{
  undefined1 *puVar1;
  pointer pAVar2;
  NodeId *pNVar3;
  pointer pBVar4;
  uint uVar5;
  ulong uVar6;
  NonHcfComponent *this_00;
  NodeId *x;
  NonHcfComponent *local_70;
  VarVec sccBodies;
  VarVec sccAtoms;
  
  sccAtoms.ebo_.buf = (pointer)0x0;
  sccAtoms.ebo_.size = 0;
  sccAtoms.ebo_.cap = 0;
  sccBodies.ebo_.buf = (pointer)0x0;
  sccBodies.ebo_.size = 0;
  sccBodies.ebo_.cap = 0;
  local_70 = (NonHcfComponent *)((ulong)local_70 & 0xffffffff00000000);
  if ((this->atoms_).ebo_.size != 0) {
    uVar6 = 0;
    do {
      if ((*(uint *)&(this->atoms_).ebo_.buf[uVar6].super_Node.field_0x4 & 0xfffffff) == scc) {
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&sccAtoms,(uint *)&local_70);
        puVar1 = &(this->atoms_).ebo_.buf[(ulong)local_70 & 0xffffffff].super_Node.field_0x4;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x80000000;
      }
      uVar5 = (int)local_70 + 1;
      uVar6 = (ulong)uVar5;
      local_70 = (NonHcfComponent *)CONCAT44(local_70._4_4_,uVar5);
    } while (uVar5 != (this->atoms_).ebo_.size);
  }
  if (sccAtoms.ebo_.size != 0) {
    uVar6 = 0;
    do {
      pAVar2 = (this->atoms_).ebo_.buf;
      pNVar3 = pAVar2[sccAtoms.ebo_.buf[uVar6]].super_Node.sep_;
      for (x = pAVar2[sccAtoms.ebo_.buf[uVar6]].super_Node.adj_; x != pNVar3; x = x + 1) {
        uVar5 = *x;
        pBVar4 = (this->bodies_).ebo_.buf;
        if (-1 < *(int *)&pBVar4[uVar5].super_Node.field_0x4) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&sccBodies,x);
          puVar1 = &pBVar4[uVar5].super_Node.field_0x7;
          *puVar1 = *puVar1 | 0x80;
        }
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != sccAtoms.ebo_.size);
  }
  if (sccBodies.ebo_.size != 0) {
    uVar5 = 0;
    do {
      puVar1 = &(this->bodies_).ebo_.buf[sccBodies.ebo_.buf[uVar5]].super_Node.field_0x4;
      *(uint *)puVar1 = *(uint *)puVar1 & 0x7fffffff;
      uVar5 = uVar5 + 1;
    } while (uVar5 != sccBodies.ebo_.size);
  }
  this_00 = (NonHcfComponent *)operator_new(0x20);
  NonHcfComponent::NonHcfComponent(this_00,id,this,ctx,config,scc,&sccAtoms,&sccBodies);
  local_70 = this_00;
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent_*,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent_*>_>
  ::push_back(&this->components_,&local_70);
  if (this->stats_ != (NonHcfStats *)0x0) {
    NonHcfStats::addHcc(this->stats_,(this->components_).ebo_.buf[(this->components_).ebo_.size - 1]
                       );
  }
  if (sccBodies.ebo_.buf != (pointer)0x0) {
    operator_delete(sccBodies.ebo_.buf);
  }
  if (sccAtoms.ebo_.buf != (pointer)0x0) {
    operator_delete(sccAtoms.ebo_.buf);
  }
  return;
}

Assistant:

void PrgDepGraph::addNonHcf(uint32 id, SharedContext& ctx, Configuration* config, uint32 scc) {
	VarVec sccAtoms, sccBodies;
	// get all atoms from scc
	for (uint32 i = 0; i != numAtoms(); ++i) {
		if (getAtom(i).scc == scc) {
			sccAtoms.push_back(i);
			atoms_[i].set(AtomNode::property_in_non_hcf);
		}
	}
	// get all bodies defining an atom in scc
	const Solver& generator = *ctx.master(); (void)generator;
	for (uint32 i = 0; i != sccAtoms.size(); ++i) {
		const AtomNode& a = getAtom(sccAtoms[i]);
		for (const NodeId* bodyIt = a.bodies_begin(), *bodyEnd = a.bodies_end(); bodyIt != bodyEnd; ++bodyIt) {
			BodyNode& B = bodies_[*bodyIt];
			if (!B.seen()) {
				assert(generator.value(B.lit.var()) != value_free || !generator.seen(B.lit));
				sccBodies.push_back(*bodyIt);
				B.seen(true);
			}
		}
	}
	for (uint32 i = 0; i != sccBodies.size(); ++i) { bodies_[sccBodies[i]].seen(false); }
	components_.push_back( new NonHcfComponent(id, *this, ctx, config, scc, sccAtoms, sccBodies) );
	if (stats_) { stats_->addHcc(*components_.back()); }
}